

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.h
# Opt level: O0

void __thiscall
kaitai::kstruct_error::kstruct_error(kstruct_error *this,string *what,string *src_path)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  string *local_20;
  string *src_path_local;
  string *what_local;
  kstruct_error *this_local;
  
  local_20 = src_path;
  src_path_local = what;
  what_local = (string *)this;
  std::operator+(&local_60,src_path,": ");
  std::operator+(&local_40,&local_60,what);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  *(undefined ***)this = &PTR__kstruct_error_0037aa28;
  std::__cxx11::string::string((string *)&this->m_src_path,(string *)src_path);
  return;
}

Assistant:

kstruct_error(const std::string what, const std::string src_path):
        std::runtime_error(src_path + ": " + what),
        m_src_path(src_path)
    {
    }